

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

Image16Bit * Image_Function::ConvertTo16Bit(Image *in)

{
  uint32_t uVar1;
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_short> *in_RDI;
  Image16Bit *out;
  uint8_t in_stack_ffffffffffffff76;
  uint8_t in_stack_ffffffffffffff77;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ImageTemplate<unsigned_short> *this;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  Image16Bit *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  Image *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe8;
  undefined2 uVar2;
  
  this = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_short>::ImageTemplate
            ((ImageTemplate<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
             ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,in_stack_ffffffffffffff76);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  uVar2 = (undefined2)(uVar1 >> 0x10);
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_short>::generate
            (this,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,(uint8_t)((ushort)uVar2 >> 8),
             (uint8_t)uVar2);
  PenguinV_Image::ImageTemplate<unsigned_short>::~ImageTemplate
            ((ImageTemplate<unsigned_short> *)0x12020d);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  ConvertTo16Bit(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  return this;
}

Assistant:

Image16Bit ConvertTo16Bit( const Image & in )
    {
        Image16Bit out = Image16Bit().generate( in.width(), in.height(), in.colorCount() );
        ConvertTo16Bit( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }